

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O0

void __thiscall
slang::parsing::Preprocessor::applyResetPragma(Preprocessor *this,PragmaDirectiveSyntax *pragma)

{
  SourceRange range;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  string_view arg_00;
  bool bVar1;
  long in_RSI;
  Preprocessor *in_RDI;
  SourceRange SVar2;
  string_view name;
  SimplePragmaExpressionSyntax *simple;
  PragmaExpressionSyntax *arg;
  const_iterator __end2;
  const_iterator __begin2;
  SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *__range2;
  iterator_base<const_slang::syntax::PragmaExpressionSyntax_*> *in_stack_fffffffffffffed8;
  SourceLocation in_stack_fffffffffffffee8;
  SourceLocation in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  DiagCode in_stack_ffffffffffffff04;
  size_t in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff30;
  string_view local_58;
  SimplePragmaExpressionSyntax *local_48;
  SyntaxNode *local_40;
  const_iterator local_38;
  const_iterator local_28;
  long local_18;
  
  local_18 = in_RSI + 0x38;
  local_28 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::begin
                       ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x24aaf5);
  local_38 = slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::end
                       ((SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax> *)0x24ab12);
  while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
                           ((self_type *)in_RDI,in_stack_fffffffffffffed8),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    local_40 = &iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                             *)0x24ab4f)->super_SyntaxNode;
    if ((local_40->kind == SimplePragmaExpression) &&
       (local_48 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                             (local_40), (local_48->value).kind == Identifier)) {
      local_58 = Token::rawText((Token *)in_stack_fffffffffffffef0);
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_58);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
                   (char *)in_stack_fffffffffffffee8);
        __x._M_str = in_stack_ffffffffffffff10;
        __x._M_len = in_stack_ffffffffffffff08;
        __y._M_len._4_4_ = in_stack_fffffffffffffefc;
        __y._M_len._0_4_ = in_stack_fffffffffffffef8;
        __y._M_str._0_4_ = in_stack_ffffffffffffff00;
        __y._M_str._4_4_ = in_stack_ffffffffffffff04;
        bVar1 = std::operator==(__x,__y);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
                     (char *)in_stack_fffffffffffffee8);
          __x_00._M_str = in_stack_ffffffffffffff10;
          __x_00._M_len = in_stack_ffffffffffffff08;
          __y_00._M_len._4_4_ = in_stack_fffffffffffffefc;
          __y_00._M_len._0_4_ = in_stack_fffffffffffffef8;
          __y_00._M_str._0_4_ = in_stack_ffffffffffffff00;
          __y_00._M_str._4_4_ = in_stack_ffffffffffffff04;
          bVar1 = std::operator==(__x_00,__y_00);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0
                       ,(char *)in_stack_fffffffffffffee8);
            __x_01._M_str = in_stack_ffffffffffffff10;
            __x_01._M_len = in_stack_ffffffffffffff08;
            __y_01._M_len._4_4_ = in_stack_fffffffffffffefc;
            __y_01._M_len._0_4_ = in_stack_fffffffffffffef8;
            __y_01._M_str._0_4_ = in_stack_ffffffffffffff00;
            __y_01._M_str._4_4_ = in_stack_ffffffffffffff04;
            bVar1 = std::operator==(__x_01,__y_01);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              SVar2 = Token::range((Token *)CONCAT44(in_stack_ffffffffffffff04,
                                                     in_stack_ffffffffffffff00));
              in_stack_ffffffffffffff30 = SVar2.startLoc;
              range.endLoc._0_4_ = in_stack_fffffffffffffef8;
              range.startLoc = in_stack_fffffffffffffef0;
              range.endLoc._4_4_ = in_stack_fffffffffffffefc;
              addDiag((Preprocessor *)in_stack_fffffffffffffee8,in_stack_ffffffffffffff04,range);
              arg_00._M_str = (char *)in_stack_ffffffffffffff30;
              arg_00._M_len = (size_t)local_58._M_str;
              Diagnostic::operator<<((Diagnostic *)local_58._M_len,arg_00);
            }
          }
        }
      }
      in_stack_ffffffffffffff10 = (char *)local_58._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
                 (char *)in_stack_fffffffffffffee8);
      __x_02._M_str = in_stack_ffffffffffffff10;
      __x_02._M_len = in_stack_ffffffffffffff08;
      __y_02._M_len._4_4_ = in_stack_fffffffffffffefc;
      __y_02._M_len._0_4_ = in_stack_fffffffffffffef8;
      __y_02._M_str._0_4_ = in_stack_ffffffffffffff00;
      __y_02._M_str._4_4_ = in_stack_ffffffffffffff04;
      bVar1 = std::operator==(__x_02,__y_02);
      if (bVar1) {
        resetProtectState(in_RDI);
      }
    }
    else {
      in_stack_fffffffffffffefc = 0x90004;
      SVar2 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_ffffffffffffff30);
      in_stack_fffffffffffffee8 = SVar2.startLoc;
      in_stack_fffffffffffffef0 = SVar2.endLoc;
      SVar2.endLoc._0_4_ = in_stack_fffffffffffffef8;
      SVar2.startLoc = in_stack_fffffffffffffef0;
      SVar2.endLoc._4_4_ = in_stack_fffffffffffffefc;
      addDiag((Preprocessor *)in_stack_fffffffffffffee8,in_stack_ffffffffffffff04,SVar2);
    }
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PragmaExpressionSyntax>::iterator_base<const_slang::syntax::PragmaExpressionSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

void Preprocessor::applyResetPragma(const PragmaDirectiveSyntax& pragma) {
    // Just check that we know about the names being reset, and warn if we don't.
    for (auto arg : pragma.args) {
        if (arg->kind == SyntaxKind::SimplePragmaExpression) {
            auto& simple = arg->as<SimplePragmaExpressionSyntax>();
            if (simple.value.kind == TokenKind::Identifier) {
                std::string_view name = simple.value.rawText();
                if (!name.empty() && name != "protect" && name != "once" && name != "diagnostic")
                    addDiag(diag::UnknownPragma, simple.value.range()) << name;

                if (name == "protect")
                    resetProtectState();

                continue;
            }
        }

        // Otherwise this isn't even a pragma name, so it's ill-formed.
        addDiag(diag::ExpectedPragmaName, arg->sourceRange());
    }
}